

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t zeGetMemExpProcAddrTable(ze_api_version_t version,ze_mem_exp_dditable_t *pDdiTable)

{
  ze_pfnMemGetFileDescriptorFromIpcHandleExp_t p_Var1;
  ze_pfnMemGetAtomicAccessAttributeExp_t p_Var2;
  ze_api_version_t *pzVar3;
  ze_result_t zVar4;
  
  pzVar3 = validation_layer::context;
  if (pDdiTable == (ze_mem_exp_dditable_t *)0x0) {
    zVar4 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnGetFileDescriptorFromIpcHandleExp;
      *(ze_pfnMemGetIpcHandleFromFileDescriptorExp_t *)(validation_layer::context + 0x106) =
           pDdiTable->pfnGetIpcHandleFromFileDescriptorExp;
      *(ze_pfnMemGetFileDescriptorFromIpcHandleExp_t *)(pzVar3 + 0x108) = p_Var1;
      pDdiTable->pfnGetIpcHandleFromFileDescriptorExp =
           validation_layer::zeMemGetIpcHandleFromFileDescriptorExp;
      pDdiTable->pfnGetFileDescriptorFromIpcHandleExp =
           validation_layer::zeMemGetFileDescriptorFromIpcHandleExp;
      p_Var2 = pDdiTable->pfnGetAtomicAccessAttributeExp;
      *(ze_pfnMemSetAtomicAccessAttributeExp_t *)(pzVar3 + 0x10a) =
           pDdiTable->pfnSetAtomicAccessAttributeExp;
      *(ze_pfnMemGetAtomicAccessAttributeExp_t *)(pzVar3 + 0x10c) = p_Var2;
      pDdiTable->pfnSetAtomicAccessAttributeExp = validation_layer::zeMemSetAtomicAccessAttributeExp
      ;
      pDdiTable->pfnGetAtomicAccessAttributeExp = validation_layer::zeMemGetAtomicAccessAttributeExp
      ;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar4;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetMemExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_mem_exp_dditable_t* pDdiTable                ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.MemExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetIpcHandleFromFileDescriptorExp        = pDdiTable->pfnGetIpcHandleFromFileDescriptorExp;
    pDdiTable->pfnGetIpcHandleFromFileDescriptorExp      = validation_layer::zeMemGetIpcHandleFromFileDescriptorExp;

    dditable.pfnGetFileDescriptorFromIpcHandleExp        = pDdiTable->pfnGetFileDescriptorFromIpcHandleExp;
    pDdiTable->pfnGetFileDescriptorFromIpcHandleExp      = validation_layer::zeMemGetFileDescriptorFromIpcHandleExp;

    dditable.pfnSetAtomicAccessAttributeExp              = pDdiTable->pfnSetAtomicAccessAttributeExp;
    pDdiTable->pfnSetAtomicAccessAttributeExp            = validation_layer::zeMemSetAtomicAccessAttributeExp;

    dditable.pfnGetAtomicAccessAttributeExp              = pDdiTable->pfnGetAtomicAccessAttributeExp;
    pDdiTable->pfnGetAtomicAccessAttributeExp            = validation_layer::zeMemGetAtomicAccessAttributeExp;

    return result;
}